

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file_dictionary_handler.c
# Opt level: O0

ion_cursor_status_t ffdict_next(ion_dict_cursor_t *cursor,ion_record_t *record)

{
  ion_flat_file_t *flat_file_00;
  ion_err_t iVar1;
  undefined1 local_68 [7];
  ion_err_t err;
  ion_flat_file_row_t row;
  undefined1 local_48 [7];
  ion_err_t err_1;
  ion_flat_file_row_t throwaway_row;
  ion_flat_file_cursor_t *flat_file_cursor;
  ion_flat_file_t *flat_file;
  ion_record_t *record_local;
  ion_dict_cursor_t *cursor_local;
  
  flat_file_00 = (ion_flat_file_t *)cursor->dictionary->instance;
  if (cursor->status == '\x03') {
    cursor_local._7_1_ = cursor->status;
  }
  else if (cursor->status == '\x01') {
    cursor_local._7_1_ = cursor->status;
  }
  else if ((cursor->status == '\x02') || (cursor->status == '\x04')) {
    throwaway_row.value = cursor;
    if (cursor->status == '\x04') {
      row.value._7_1_ = '\x12';
      switch(cursor->predicate->type) {
      case '\0':
        row.value._7_1_ =
             flat_file_scan(flat_file_00,*(long *)(cursor + 1) + 1,(ion_fpos_t *)(cursor + 1),
                            (ion_flat_file_row_t *)local_48,'\x01',flat_file_predicate_key_match,
                            (cursor->predicate->statement).range.lower_bound);
        break;
      case '\x01':
        row.value._7_1_ =
             flat_file_scan(flat_file_00,*(long *)(cursor + 1) + 1,(ion_fpos_t *)(cursor + 1),
                            (ion_flat_file_row_t *)local_48,'\x01',flat_file_predicate_within_bounds
                            ,(cursor->predicate->statement).range.lower_bound,
                            (cursor->predicate->statement).range.upper_bound);
        break;
      case '\x02':
        row.value._7_1_ =
             flat_file_scan(flat_file_00,*(long *)(cursor + 1) + 1,(ion_fpos_t *)(cursor + 1),
                            (ion_flat_file_row_t *)local_48,'\x01',flat_file_predicate_not_empty);
        break;
      case '\x03':
      }
      if (row.value._7_1_ == '\x0e') {
        cursor->status = '\x01';
        return cursor->status;
      }
      if (row.value._7_1_ != '\0') {
        cursor->status = '\x05';
        return cursor->status;
      }
    }
    else {
      cursor->status = '\x04';
    }
    iVar1 = flat_file_read_row(flat_file_00,*(ion_fpos_t *)((long)throwaway_row.value + 0x28),
                               (ion_flat_file_row_t *)local_68);
    if (iVar1 == '\0') {
      memcpy(record->key,(void *)row._0_8_,(long)(cursor->dictionary->instance->record).key_size);
      memcpy(record->value,row.key,(long)(cursor->dictionary->instance->record).value_size);
      cursor_local._7_1_ = cursor->status;
    }
    else {
      cursor_local._7_1_ = -1;
    }
  }
  else {
    cursor_local._7_1_ = '\0';
  }
  return cursor_local._7_1_;
}

Assistant:

ion_cursor_status_t
ffdict_next(
	ion_dict_cursor_t	*cursor,
	ion_record_t		*record
) {
	ion_flat_file_t			*flat_file			= (ion_flat_file_t *) cursor->dictionary->instance;
	ion_flat_file_cursor_t	*flat_file_cursor	= (ion_flat_file_cursor_t *) cursor;

	if (cursor->status == cs_cursor_uninitialized) {
		return cursor->status;
	}
	else if (cursor->status == cs_end_of_results) {
		return cursor->status;
	}
	else if ((cursor->status == cs_cursor_initialized) || (cursor->status == cs_cursor_active)) {
		if (cursor->status == cs_cursor_active) {
			ion_flat_file_row_t throwaway_row;
			ion_err_t			err = err_uninitialized;

			switch (cursor->predicate->type) {
				case predicate_equality: {
					err = flat_file_scan(flat_file, flat_file_cursor->current_location + 1, &flat_file_cursor->current_location, &throwaway_row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, cursor->predicate->statement.equality.equality_value);

					break;
				}

				case predicate_range: {
					err = flat_file_scan(flat_file, flat_file_cursor->current_location + 1, &flat_file_cursor->current_location, &throwaway_row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_within_bounds, cursor->predicate->statement.range.lower_bound, cursor->predicate->statement.range.upper_bound);

					break;
				}

				case predicate_all_records: {
					err = flat_file_scan(flat_file, flat_file_cursor->current_location + 1, &flat_file_cursor->current_location, &throwaway_row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_not_empty);

					break;
				}

				case predicate_predicate: {
					break;
				}
			}

			if (err_file_hit_eof == err) {
				cursor->status = cs_end_of_results;
				return cursor->status;
			}
			else if (err_ok != err) {
				cursor->status = cs_possible_data_inconsistency;
				return cursor->status;
			}
		}
		else {
			/* The status is cs_cursor_initialized */
			cursor->status = cs_cursor_active;
		}

		ion_flat_file_row_t row;
		ion_err_t			err = flat_file_read_row(flat_file, flat_file_cursor->current_location, &row);

		if (err_ok != err) {
			return cs_invalid_index;
		}

		/*Copy both key and value into user provided struct */
		memcpy(record->key, row.key, cursor->dictionary->instance->record.key_size);
		memcpy(record->value, row.value, cursor->dictionary->instance->record.value_size);

		return cursor->status;
	}

	return cs_invalid_cursor;
}